

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O1

Map_Time_t * Abc_NtkMapCopyCiArrival(Abc_Ntk_t *pNtk,Abc_Time_t *ppTimes)

{
  float fVar1;
  Map_Time_t *pMVar2;
  float *pfVar3;
  size_t sVar4;
  size_t __nmemb;
  float fVar5;
  
  __nmemb = (size_t)pNtk->vCis->nSize;
  pMVar2 = (Map_Time_t *)calloc(__nmemb,0xc);
  if (0 < (long)__nmemb) {
    pfVar3 = &pMVar2->Worst;
    sVar4 = 0;
    do {
      fVar5 = ppTimes[sVar4].Fall;
      pfVar3[-1] = fVar5;
      fVar1 = ppTimes[sVar4].Rise;
      ((Map_Time_t *)(pfVar3 + -2))->Rise = fVar1;
      if (fVar5 <= fVar1) {
        fVar5 = fVar1;
      }
      *pfVar3 = fVar5;
      sVar4 = sVar4 + 1;
      pfVar3 = pfVar3 + 3;
    } while (__nmemb != sVar4);
  }
  if (ppTimes != (Abc_Time_t *)0x0) {
    free(ppTimes);
  }
  return pMVar2;
}

Assistant:

Map_Time_t * Abc_NtkMapCopyCiArrival( Abc_Ntk_t * pNtk, Abc_Time_t * ppTimes )
{
    Map_Time_t * p;
    int i;
    p = ABC_CALLOC( Map_Time_t, Abc_NtkCiNum(pNtk) );
    for ( i = 0; i < Abc_NtkCiNum(pNtk); i++ )
    {
        p[i].Fall = ppTimes[i].Fall;
        p[i].Rise = ppTimes[i].Rise;
        p[i].Worst = Abc_MaxFloat( p[i].Fall, p[i].Rise );
    }
    ABC_FREE( ppTimes );
    return p;
}